

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::ForumTag::ForumTag(ForumTag *this,ForumTag *param_1)

{
  _Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var5;
  pointer *__ptr_1;
  pointer *__ptr;
  
  _Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (param_1->id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>;
  if (_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl == (Snowflake *)0x0) {
    _Var3._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var3._M_head_impl = (Snowflake *)operator_new(8);
    (_Var3._M_head_impl)->_value =
         *(uint64_t *)_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var3._M_head_impl;
  (this->id).s_ = (param_1->id).s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  _Var2._M_head_impl =
       (param_1->moderated).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var4._M_head_impl = (bool *)0x0;
  }
  else {
    _Var4._M_head_impl = (bool *)operator_new(1);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->moderated).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  (this->moderated).s_ = (param_1->moderated).s_;
  _Var3._M_head_impl =
       (param_1->emoji_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (Snowflake *)0x0) {
    _Var5._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var5._M_head_impl = (Snowflake *)operator_new(8);
    (_Var5._M_head_impl)->_value = (_Var3._M_head_impl)->_value;
  }
  (this->emoji_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->emoji_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->emoji_id).super_field<discordpp::Snowflake>.s_;
  (this->emoji_id)._vptr_nullable_field = (_func_int **)&PTR_operator__0024a4f0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->emoji_name).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->emoji_name).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->emoji_name)._vptr_nullable_field = (_func_int **)&PTR_operator__0024a208;
  return;
}

Assistant:

ForumTag(
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        field<bool> moderated = uninitialized,
        nullable_field<Snowflake> emoji_id = uninitialized,
        nullable_field<std::string> emoji_name = uninitialized
    ):
        id(id),
        name(name),
        moderated(moderated),
        emoji_id(emoji_id),
        emoji_name(emoji_name)
    {}